

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_map_forEach(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  JSRuntime *pJVar4;
  long lVar5;
  int iVar6;
  JSRefCountHeader *p;
  int64_t iVar7;
  JSRefCountHeader *p_4;
  ulong uVar8;
  JSValueUnion JVar9;
  ulong uVar10;
  undefined4 in_register_0000008c;
  long *plVar11;
  long *plVar12;
  JSValue v;
  JSValue v_00;
  JSValue JVar13;
  JSValue JVar14;
  JSValue this_obj;
  ulong local_a0;
  ulong local_98;
  int64_t local_90;
  JSValueUnion local_88;
  long lStack_80;
  JSValueUnion local_78;
  long lStack_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_50;
  undefined8 local_48;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  local_48 = CONCAT44(in_register_0000008c,magic);
  JVar9 = this_val.u;
  if ((((int)this_val.tag == -1) && (magic + 0x1fU == (uint)*(ushort *)((long)JVar9.ptr + 6))) &&
     (lVar3 = *(long *)((long)JVar9.ptr + 0x30), lVar3 != 0)) {
    JVar13 = *argv;
    if (argc < 2) {
      local_90 = 3;
      local_98 = 0;
      local_a0 = 0;
    }
    else {
      local_90 = argv[1].tag;
      local_a0 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
      local_98 = (ulong)argv[1].u.ptr & 0xffffffff;
    }
    iVar6 = check_function(ctx,*argv);
    if (iVar6 != 0) goto LAB_0014542f;
    iVar7 = 3;
    if (*(long **)(lVar3 + 0x10) != (long *)(lVar3 + 8)) {
      uVar8 = 0;
      plVar12 = *(long **)(lVar3 + 0x10);
      local_50 = JVar9;
      do {
        if (*(int *)((long)plVar12 + -0x14) == 0) {
          *(int *)(plVar12 + -3) = (int)plVar12[-3] + 1;
          local_78 = (JSValueUnion)((JSValueUnion *)(plVar12 + 4))->ptr;
          lStack_70 = plVar12[5];
          if (0xfffffff4 < (uint)lStack_70) {
            *(int *)local_78.ptr = *local_78.ptr + 1;
          }
          iVar6 = (int)local_48;
          local_88 = local_78;
          lStack_80 = lStack_70;
          if (iVar6 == 0) {
            local_88 = (JSValueUnion)((JSValueUnion *)(plVar12 + 6))->ptr;
            lStack_80 = plVar12[7];
            if (0xfffffff4 < (uint)lStack_80) {
              *(int *)local_88.ptr = *local_88.ptr + 1;
            }
          }
          local_68.float64 = local_50.float64;
          local_40 = 0;
          uStack_38 = 3;
          JVar14.tag = 3;
          JVar14.u.ptr = (void *)((ulong)uStack_3c << 0x20);
          this_obj.tag = local_90;
          this_obj.u.ptr = (void *)(local_a0 | local_98);
          local_60 = this_val.tag;
          JVar14 = JS_CallInternal(ctx,JVar13,this_obj,JVar14,3,(JSValue *)&local_88,2);
          iVar7 = JVar14.tag;
          JVar9 = JVar14.u;
          if ((0xfffffff4 < (uint)lStack_80) &&
             (iVar2 = *local_88.ptr, *(int *)local_88.ptr = iVar2 + -1, iVar2 < 2)) {
            v.tag = lStack_80;
            v.u.ptr = local_88.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
          if (((iVar6 == 0) && (0xfffffff4 < (uint)lStack_70)) &&
             (iVar6 = *local_78.ptr, *(int *)local_78.ptr = iVar6 + -1, iVar6 < 2)) {
            v_00.tag = lStack_70;
            v_00.u.ptr = local_78.ptr;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          plVar11 = (long *)plVar12[1];
          pJVar4 = ctx->rt;
          plVar1 = plVar12 + -3;
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            lVar5 = *plVar12;
            *(long **)(lVar5 + 8) = plVar11;
            *plVar11 = lVar5;
            *plVar12 = 0;
            plVar12[1] = 0;
            (*(pJVar4->mf).js_free)(&pJVar4->malloc_state,plVar12 + -3);
          }
          if ((uint)JVar14.tag == 6) {
            uVar10 = (ulong)JVar9.ptr & 0xffffffff00000000;
            uVar8 = (ulong)JVar9.ptr & 0xffffffff;
            goto LAB_00145438;
          }
          if ((0xfffffff4 < (uint)JVar14.tag) &&
             (iVar6 = *JVar9.ptr, *(int *)JVar9.ptr = iVar6 + -1, iVar6 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar14);
          }
        }
        else {
          plVar11 = (long *)plVar12[1];
        }
        plVar12 = plVar11;
      } while (plVar11 != (long *)(lVar3 + 8));
      uVar10 = 0;
      iVar7 = 3;
      goto LAB_00145438;
    }
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,magic + 0x1fU);
LAB_0014542f:
    iVar7 = 6;
  }
  uVar8 = 0;
  uVar10 = 0;
LAB_00145438:
  JVar13.tag = iVar7;
  JVar13.u.ptr = (void *)(uVar8 | uVar10);
  return JVar13;
}

Assistant:

static JSValue js_map_forEach(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSValueConst func, this_arg;
    JSValue ret, args[3];
    struct list_head *el;
    JSMapRecord *mr;

    if (!s)
        return JS_EXCEPTION;
    func = argv[0];
    if (argc > 1)
        this_arg = argv[1];
    else
        this_arg = JS_UNDEFINED;
    if (check_function(ctx, func))
        return JS_EXCEPTION;
    /* Note: the list can be modified while traversing it, but the
       current element is locked */
    el = s->records.next;
    while (el != &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty) {
            mr->ref_count++;
            /* must duplicate in case the record is deleted */
            args[1] = JS_DupValue(ctx, mr->key);
            if (magic)
                args[0] = args[1];
            else
                args[0] = JS_DupValue(ctx, mr->value);
            args[2] = (JSValue)this_val;
            ret = JS_Call(ctx, func, this_arg, 3, (JSValueConst *)args);
            JS_FreeValue(ctx, args[0]);
            if (!magic)
                JS_FreeValue(ctx, args[1]);
            el = el->next;
            map_decref_record(ctx->rt, mr);
            if (JS_IsException(ret))
                return ret;
            JS_FreeValue(ctx, ret);
        } else {
            el = el->next;
        }
    }
    return JS_UNDEFINED;
}